

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

complex<float> __thiscall soul::Value::PackedData::getAsComplex32(PackedData *this)

{
  bool bVar1;
  complex<float> cVar2;
  _ComplexT extraout_RAX;
  complex<double> local_28;
  PackedData *local_18;
  PackedData *this_local;
  
  local_18 = this;
  bVar1 = Type::isComplex32(this->type);
  if (bVar1) {
    cVar2 = getAs<std::complex<float>>(this);
  }
  else {
    getAsComplex64(this);
    std::complex<float>::complex((complex<float> *)&this_local,&local_28);
    cVar2._M_value = extraout_RAX;
  }
  return (complex<float>)cVar2._M_value;
}

Assistant:

std::complex<float> getAsComplex32() const
    {
        if (type.isComplex32())
            return getAs<std::complex<float>>();

        return static_cast<std::complex<float>> (getAsComplex64());
    }